

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

void __thiscall
Clasp::ClaspFacade::SolveStrategy::SolveStrategy
          (SolveStrategy *this,SolveMode_t m,ClaspFacade *f,SolveAlgorithm *algo)

{
  undefined8 in_RCX;
  __atomic_base<unsigned_int> *in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  __int_type __i;
  
  *in_RDI = &PTR__SolveStrategy_002dc1f0;
  in_RDI[1] = in_RDX;
  in_RDI[2] = in_RCX;
  std::__cxx11::string::string((string *)(in_RDI + 3));
  in_RDI[7] = 0;
  *(undefined4 *)(in_RDI + 10) = in_ESI;
  __i = (__int_type)((ulong)in_RCX >> 0x20);
  std::__atomic_base<unsigned_int>::operator=(in_RDX,__i);
  std::__atomic_base<unsigned_int>::operator=(in_RDX,__i);
  std::__atomic_base<unsigned_int>::operator=(in_RDX,__i);
  return;
}

Assistant:

ClaspFacade::SolveStrategy::SolveStrategy(SolveMode_t m, ClaspFacade& f, SolveAlgorithm* algo)
	: facade_(&f)
	, algo_(algo)
	, handler_(0)
	, mode_(m) {
	nrefs_ = 1;
	state_ = signal_ = 0;
}